

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O3

void i_string_suite::i_string_incomplete_surrogates_escape_valid(void)

{
  char input [18];
  reader reader;
  undefined4 local_18c;
  view_type local_188;
  char local_178 [32];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_178,"[\"\\uD800\\uD800\n\"]",0x12);
  local_188._M_len = strlen(local_178);
  local_188._M_str = local_178;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_188);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xfe,"void i_string_suite::i_string_incomplete_surrogates_escape_valid()",&local_188,
             &local_18c);
  trial::protocol::json::basic_reader<char>::next(&local_158);
  local_188._M_len = CONCAT44(local_188._M_len._4_4_,local_158.decoder.current.code);
  local_18c = 0xffffffff;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::error_unexpected_token",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x101,"void i_string_suite::i_string_incomplete_surrogates_escape_valid()",&local_188,
             &local_18c);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void i_string_incomplete_surrogates_escape_valid()
{
    const char input[] = "[\"\\uD800\\uD800\n\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    // Newline is illegal in string
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::error_unexpected_token);
}